

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O1

void * get_buffer(lua_State *L,int index,int *sz)

{
  size_t __n;
  int iVar1;
  void *__dest;
  lua_Integer lVar2;
  char *__src;
  size_t len;
  size_t local_30;
  
  iVar1 = lua_isuserdata(L,index);
  if (iVar1 == 0) {
    local_30 = 0;
    __src = luaL_checklstring(L,index,&local_30);
    __n = local_30;
    __dest = malloc(local_30);
    memcpy(__dest,__src,__n);
    *sz = (int)__n;
  }
  else {
    __dest = lua_touserdata(L,index);
    lVar2 = luaL_checkinteger(L,index + 1);
    *sz = (int)lVar2;
  }
  return __dest;
}

Assistant:

static void *
get_buffer(lua_State *L, int index, int *sz) {
	void *buffer;
	if (lua_isuserdata(L,index)) {
		buffer = lua_touserdata(L,index);
		*sz = luaL_checkinteger(L,index+1);
	} else {
		size_t len = 0;
		const char * str =  luaL_checklstring(L, index, &len);
		buffer = skynet_malloc(len);
		memcpy(buffer, str, len);
		*sz = (int)len;
	}
	return buffer;
}